

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O2

void * duckdb_je_hook_install(tsdn_t *tsdn,hooks_t *to_install)

{
  seq_hooks_t *psVar1;
  long lVar2;
  seq_hooks_t *src;
  hooks_internal_t local_58;
  
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)to_install);
  lVar2 = 5;
  psVar1 = hooks;
  do {
    src = psVar1;
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      src = (seq_hooks_t *)0x0;
      goto LAB_00e6b34b;
    }
    seq_try_load_hooks(&local_58,src);
    psVar1 = src + 1;
  } while (local_58.in_use != false);
  local_58.hooks.alloc_hook = to_install->alloc_hook;
  local_58.hooks.dalloc_hook = to_install->dalloc_hook;
  local_58.hooks.expand_hook = to_install->expand_hook;
  local_58.hooks.extra = to_install->extra;
  local_58.in_use = true;
  seq_store_hooks(src,&local_58);
  nhooks.repr = nhooks.repr + 1;
  duckdb_je_tsd_global_slow_inc(tsdn);
LAB_00e6b34b:
  hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
  return src;
}

Assistant:

void *
hook_install(tsdn_t *tsdn, hooks_t *to_install) {
	malloc_mutex_lock(tsdn, &hooks_mu);
	void *ret = hook_install_locked(to_install);
	if (ret != NULL) {
		tsd_global_slow_inc(tsdn);
	}
	malloc_mutex_unlock(tsdn, &hooks_mu);
	return ret;
}